

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

size_t __thiscall
kj::_::Delimited<kj::ArrayPtr<const_kj::HttpByteRange>_>::size
          (Delimited<kj::ArrayPtr<const_kj::HttpByteRange>_> *this)

{
  size_t sVar1;
  size_t sVar2;
  String *e;
  String *pSVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  long lVar3;
  
  ensureStringifiedInitialized(this);
  pSVar4 = (this->stringified).ptr;
  bVar6 = true;
  sVar2 = 0;
  for (lVar5 = (this->stringified).size_ * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
    lVar7 = (this->delimiter).content.size_ - 1;
    if (bVar6) {
      lVar7 = 0;
    }
    sVar1 = (pSVar4->content).size_;
    lVar3 = sVar1 - 1;
    if (sVar1 == 0) {
      lVar3 = 0;
    }
    sVar2 = lVar3 + lVar7 + sVar2;
    pSVar4 = pSVar4 + 1;
    bVar6 = false;
  }
  return sVar2;
}

Assistant:

size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }